

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<int,_bool>_>::freeData
          (Span<QHashPrivate::Node<int,_bool>_> *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x80) != 0) {
    if (*(void **)(in_RDI + 0x80) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x80));
    }
    *(undefined8 *)(in_RDI + 0x80) = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }